

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_zstd.c
# Opt level: O0

int archive_read_support_filter_zstd(archive *_a)

{
  int iVar1;
  archive_read *a;
  archive *_a_local;
  
  iVar1 = __archive_read_register_bidder((archive_read *)_a,(void *)0x0,"zstd",&zstd_bidder_vtable);
  if (iVar1 == 0) {
    _a_local._4_4_ = 0;
  }
  else {
    _a_local._4_4_ = -0x1e;
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_read_support_filter_zstd(struct archive *_a)
{
	struct archive_read *a = (struct archive_read *)_a;

	if (__archive_read_register_bidder(a, NULL, "zstd",
				&zstd_bidder_vtable) != ARCHIVE_OK)
		return (ARCHIVE_FATAL);

#if HAVE_ZSTD_H && HAVE_LIBZSTD
	return (ARCHIVE_OK);
#else
	archive_set_error(_a, ARCHIVE_ERRNO_MISC,
	    "Using external zstd program for zstd decompression");
	return (ARCHIVE_WARN);
#endif
}